

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O3

const_varint_iterator<long> * __thiscall
protozero::const_varint_iterator<long>::operator++(const_varint_iterator<long> *this)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 *puVar3;
  char *pcVar4;
  long lVar5;
  pointer_____offset_0x10___ *ppuVar6;
  
  pcVar1 = this->m_data;
  if (pcVar1 == (char *)0x0) {
    __assert_fail("m_data",
                  "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/include/protozero/iterators.hpp"
                  ,0x159,
                  "const_varint_iterator<T> &protozero::const_varint_iterator<long>::operator++() [T = long]"
                 );
  }
  pcVar2 = this->m_end;
  if (pcVar1 != pcVar2) {
    lVar5 = 0;
    pcVar4 = pcVar1;
    do {
      if (-1 < *pcVar4) {
        if (lVar5 < 10) {
          this->m_data = pcVar4 + 1;
          return this;
        }
        goto LAB_00103b38;
      }
      pcVar4 = pcVar4 + 1;
      lVar5 = lVar5 + 1;
    } while (pcVar4 != pcVar2);
  }
  if ((long)pcVar2 - (long)pcVar1 < 10) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_00106cd0;
    ppuVar6 = &end_of_buffer_exception::typeinfo;
  }
  else {
LAB_00103b38:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_00106ca8;
    ppuVar6 = &varint_too_long_exception::typeinfo;
  }
  __cxa_throw(puVar3,ppuVar6,std::exception::~exception);
}

Assistant:

const_varint_iterator& operator++() {
        protozero_assert(m_data);
        skip_varint(&m_data, m_end);
        return *this;
    }